

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O2

void __thiscall
llm_build_gemma3::llm_build_gemma3
          (llm_build_gemma3 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  float fVar1;
  uint32_t uVar2;
  ggml_context *pgVar3;
  llama_hparams *plVar4;
  llama_cparams *plVar5;
  pointer plVar6;
  float *pfVar7;
  bool bVar8;
  ggml_tensor *pgVar9;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  float *pfVar13;
  int il;
  uint32_t il_00;
  long lVar14;
  long lVar15;
  float fVar16;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  uVar2 = ((this->super_llm_graph_context).hparams)->n_embd_head_k;
  local_58 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  if (((this->super_llm_graph_context).ubatch)->token != (llama_token *)0x0) {
    fVar16 = (float)(this->super_llm_graph_context).n_embd;
    pgVar3 = (this->super_llm_graph_context).ctx0;
    if (fVar16 < 0.0) {
      fVar16 = sqrtf(fVar16);
    }
    else {
      fVar16 = SQRT(fVar16);
    }
    local_58 = (ggml_tensor *)ggml_scale(fVar16,pgVar3,local_58);
    llm_graph_context::cb(&this->super_llm_graph_context,local_58,"inp_scaled",-1);
  }
  pgVar9 = llm_graph_context::build_inp_pos(&this->super_llm_graph_context);
  inp = llm_graph_context::build_attn_inp_kv_unified(&this->super_llm_graph_context);
  lVar15 = 0;
  for (lVar14 = 0; lVar14 < (this->super_llm_graph_context).n_layer; lVar14 = lVar14 + 1) {
    il_00 = (uint32_t)lVar14;
    bVar8 = llama_hparams::is_swa((this->super_llm_graph_context).hparams,il_00);
    plVar4 = (this->super_llm_graph_context).hparams;
    plVar5 = (this->super_llm_graph_context).cparams;
    pfVar13 = &plVar5->rope_freq_scale;
    pfVar7 = &plVar5->rope_freq_base;
    if (bVar8) {
      pfVar13 = &plVar4->rope_freq_scale_train_swa;
      pfVar7 = &plVar4->rope_freq_base_train_swa;
    }
    fVar16 = *pfVar7;
    fVar1 = *pfVar13;
    pgVar10 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,local_58,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_norm + lVar15),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"attn_norm",il_00);
    pgVar11 = llm_graph_context::build_lora_mm
                        (&this->super_llm_graph_context,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->wq + lVar15),pgVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Qcur",il_00);
    pgVar12 = llm_graph_context::build_lora_mm
                        (&this->super_llm_graph_context,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->wk + lVar15),pgVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Kcur",il_00);
    pgVar10 = llm_graph_context::build_lora_mm
                        (&this->super_llm_graph_context,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->wv + lVar15),pgVar10);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Vcur",il_00);
    pgVar11 = (ggml_tensor *)
              ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar11,uVar2,
                              (this->super_llm_graph_context).n_head,
                              (long)(this->super_llm_graph_context).n_tokens);
    pgVar12 = (ggml_tensor *)
              ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar12,uVar2,
                              (this->super_llm_graph_context).n_head_kv,
                              (long)(this->super_llm_graph_context).n_tokens);
    pgVar10 = (ggml_tensor *)
              ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar10,uVar2,
                              (this->super_llm_graph_context).n_head_kv,
                              (long)(this->super_llm_graph_context).n_tokens);
    pgVar11 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar11,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_q_norm + lVar15),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Qcur_normed",il_00);
    pgVar11 = (ggml_tensor *)
              ggml_rope_ext(fVar16,fVar1,(this->super_llm_graph_context).ext_factor,
                            (this->super_llm_graph_context).attn_factor,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,pgVar11,pgVar9,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            (this->super_llm_graph_context).n_ctx_orig);
    pgVar12 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar12,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_k_norm + lVar15),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Kcur_normed",il_00);
    pgVar12 = (ggml_tensor *)
              ggml_rope_ext(fVar16,fVar1,(this->super_llm_graph_context).ext_factor,
                            (this->super_llm_graph_context).attn_factor,
                            (this->super_llm_graph_context).beta_fast,
                            (this->super_llm_graph_context).beta_slow,
                            (this->super_llm_graph_context).ctx0,pgVar12,pgVar9,0,
                            (int)(this->super_llm_graph_context).n_rot,
                            (this->super_llm_graph_context).rope_type,
                            (this->super_llm_graph_context).n_ctx_orig);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"Qcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar12,"Kcur",il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"Vcur",il_00);
    pgVar10 = llm_graph_context::build_attn
                        (&this->super_llm_graph_context,inp,gf,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->wo + lVar15),
                         (ggml_tensor *)0x0,pgVar11,pgVar12,pgVar10,(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,
                         ((this->super_llm_graph_context).hparams)->f_attention_scale,il_00);
    pgVar10 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar10,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->attn_post_norm +
                          lVar15),(ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"attn_post_norm",il_00);
    if (lVar14 == (this->super_llm_graph_context).n_layer + -1) {
      pgVar11 = llm_graph_context::build_inp_out_ids(&this->super_llm_graph_context);
      pgVar10 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,pgVar10,pgVar11);
      local_58 = (ggml_tensor *)ggml_get_rows((this->super_llm_graph_context).ctx0,local_58,pgVar11)
      ;
    }
    pgVar10 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar10,local_58);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar10,"sa_out",il_00);
    pgVar11 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar10,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ffn_norm + lVar15),
                         (ggml_tensor *)0x0,LLM_NORM_RMS,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_norm",il_00);
    plVar6 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pgVar11 = llm_graph_context::build_ffn
                        (&this->super_llm_graph_context,pgVar11,
                         *(ggml_tensor **)((long)&plVar6->ffn_up + lVar15),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,*(ggml_tensor **)((long)&plVar6->ffn_gate + lVar15),
                         (ggml_tensor *)0x0,(ggml_tensor *)0x0,
                         *(ggml_tensor **)((long)&plVar6->ffn_down + lVar15),(ggml_tensor *)0x0,
                         (ggml_tensor *)0x0,(ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_PAR,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_out",il_00);
    pgVar11 = llm_graph_context::build_norm
                        (&this->super_llm_graph_context,pgVar11,
                         *(ggml_tensor **)
                          ((long)&((model->layers).
                                   super__Vector_base<llama_layer,_std::allocator<llama_layer>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->ffn_post_norm + lVar15
                          ),(ggml_tensor *)0x0,LLM_NORM_RMS,-1);
    llm_graph_context::cb(&this->super_llm_graph_context,pgVar11,"ffn_post_norm",-1);
    pgVar10 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar11,pgVar10);
    local_58 = llm_graph_context::build_cvec(&this->super_llm_graph_context,pgVar10,il_00);
    llm_graph_context::cb(&this->super_llm_graph_context,local_58,"l_out",il_00);
    lVar15 = lVar15 + 0x4f0;
  }
  pgVar9 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,local_58,model->output_norm,(ggml_tensor *)0x0,
                      LLM_NORM_RMS,-1);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"result_norm",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar9;
  pgVar9 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar9);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar9,"result_output",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_logits = pgVar9;
  ggml_build_forward_expand(gf,pgVar9);
  return;
}

Assistant:

llm_build_gemma3(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_k;

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // important: do not normalize weights for raw embeddings input (i.e. encoded image emdeddings)
        if (ubatch.token) {
            inpL = ggml_scale(ctx0, inpL, sqrtf(n_embd));
            cb(inpL, "inp_scaled", -1);
        }

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        // TODO: is causal == true correct? might need some changes
        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            const bool is_swa = hparams.is_swa(il);

            const float freq_base_l  = is_swa ? hparams.rope_freq_base_train_swa  : cparams.rope_freq_base;
            const float freq_scale_l = is_swa ? hparams.rope_freq_scale_train_swa : cparams.rope_freq_scale;

            // norm
            cur = build_norm(inpL, model.layers[il].attn_norm, NULL, LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = build_norm(Qcur, model.layers[il].attn_q_norm, NULL, LLM_NORM_RMS, il);
                cb(Qcur, "Qcur_normed", il);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base_l, freq_scale_l,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                Kcur = build_norm(Kcur, model.layers[il].attn_k_norm, NULL, LLM_NORM_RMS, il);
                cb(Kcur, "Kcur_normed", il);

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base_l, freq_scale_l,
                        ext_factor, attn_factor, beta_fast, beta_slow);

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, hparams.f_attention_scale, il);
            }

            cur = build_norm(cur,
                    model.layers[il].attn_post_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_post_norm", il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            ggml_tensor * sa_out = ggml_add(ctx0, cur, inpL);
            cb(sa_out, "sa_out", il);

            cur = build_norm(sa_out,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            // feed-forward network
            {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_GELU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = build_norm(cur,
                    model.layers[il].ffn_post_norm, NULL,
                    LLM_NORM_RMS, -1);
            cb(cur, "ffn_post_norm", -1);

            cur = ggml_add(ctx0, cur, sa_out);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }